

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_windows.cpp
# Opt level: O0

void __thiscall Screen_Manager::Remove(Screen_Manager *this,Screen_Info *screen)

{
  int iVar1;
  bool bVar2;
  Screen_Info *local_30;
  int fd;
  Screen_Info *screen_local;
  Screen_Manager *this_local;
  
  if (this->head == screen) {
    if (screen->next == screen) {
      local_30 = (Screen_Info *)0x0;
    }
    else {
      local_30 = screen->next;
    }
    this->head = local_30;
  }
  iVar1 = XConnectionNumber(screen->dpy);
  (this->read_flag).fds_bits[iVar1 / 0x40] =
       (1L << ((byte)((long)iVar1 % 0x40) & 0x3f) ^ 0xffffffffffffffffU) &
       (this->read_flag).fds_bits[iVar1 / 0x40];
  while( true ) {
    bVar2 = false;
    if (0 < this->nfds) {
      bVar2 = ((this->read_flag).fds_bits[(this->nfds + -1) / 0x40] &
              1L << ((byte)((long)(this->nfds + -1) % 0x40) & 0x3f)) == 0;
    }
    if (!bVar2) break;
    this->nfds = this->nfds + -1;
  }
  screen->next->prev = screen->prev;
  screen->prev->next = screen->next;
  if (screen != (Screen_Info *)0x0) {
    Screen_Info::~Screen_Info(screen);
    operator_delete(screen);
  }
  return;
}

Assistant:

void
Screen_Manager::Remove(Screen_Manager::Screen_Info *screen)
{
  if (head == screen)
    head = (screen->next == screen) ? nullptr : screen->next;

  int fd = XConnectionNumber(screen->dpy);
  FD_CLR(fd, &read_flag);
  while (nfds > 0 && !FD_ISSET(nfds - 1, &read_flag))
    --nfds;

  screen->next->prev = screen->prev;
  screen->prev->next = screen->next;
  delete screen;
}